

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nArg,u8 enc,u8 createFlag)

{
  int iVar1;
  int iVar2;
  sqlite3 *psVar3;
  byte *local_60;
  u8 *z;
  FuncDef *pOther;
  int score_1;
  int score;
  int nName;
  int h;
  int bestScore;
  FuncDef *pBest;
  FuncDef *p;
  u8 createFlag_local;
  u8 enc_local;
  int nArg_local;
  char *zName_local;
  sqlite3 *db_local;
  
  _h = (sqlite3 *)0x0;
  nName = 0;
  iVar1 = sqlite3Strlen30(zName);
  for (pBest = (FuncDef *)sqlite3HashFind(&db->aFunc,zName); pBest != (FuncDef *)0x0;
      pBest = pBest->pNext) {
    iVar2 = matchQuality(pBest,nArg,enc);
    if (nName < iVar2) {
      _h = (sqlite3 *)pBest;
      nName = iVar2;
    }
  }
  if ((createFlag == '\0') && ((_h == (sqlite3 *)0x0 || ((db->mDbFlags & 2) != 0)))) {
    nName = 0;
    for (pBest = sqlite3FunctionSearch((int)((uint)""[(byte)*zName] + iVar1) % 0x17,zName);
        pBest != (FuncDef *)0x0; pBest = pBest->pNext) {
      iVar2 = matchQuality(pBest,nArg,enc);
      if (nName < iVar2) {
        _h = (sqlite3 *)pBest;
        nName = iVar2;
      }
    }
  }
  if (((createFlag != '\0') && (nName < 6)) &&
     (_h = (sqlite3 *)sqlite3DbMallocZero(db,(long)iVar1 + 0x49), _h != (sqlite3 *)0x0)) {
    _h->lastRowid = (i64)&_h->nSchemaLock;
    *(i8 *)&_h->pVfs = (i8)nArg;
    *(uint *)((long)&_h->pVfs + 4) = (uint)enc;
    memcpy(&_h->nSchemaLock,zName,(long)(iVar1 + 1));
    for (local_60 = (byte *)_h->lastRowid; *local_60 != 0; local_60 = local_60 + 1) {
      *local_60 = ""[*local_60];
    }
    psVar3 = (sqlite3 *)sqlite3HashInsert(&db->aFunc,(char *)_h->lastRowid,_h);
    if (psVar3 == _h) {
      sqlite3DbFree(db,_h);
      sqlite3OomFault(db);
      return (FuncDef *)0x0;
    }
    _h->pDfltColl = (CollSeq *)psVar3;
  }
  if ((_h == (sqlite3 *)0x0) || ((_h->mutex == (sqlite3_mutex *)0x0 && (createFlag == '\0')))) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = _h;
  }
  return (FuncDef *)db_local;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  zero-terminated */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */
  int nName;          /* Length of the name */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  nName = sqlite3Strlen30(zName);

  /* First search for a match amongst the application-defined functions.
  */
  p = (FuncDef*)sqlite3HashFind(&db->aFunc, zName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the DBFLAG_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */ 
  if( !createFlag && (pBest==0 || (db->mDbFlags & DBFLAG_PreferBuiltin)!=0) ){
    bestScore = 0;
    h = SQLITE_FUNC_HASH(sqlite3UpperToLower[(u8)zName[0]], nName);
    p = sqlite3FunctionSearch(h, zName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH && 
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    FuncDef *pOther;
    u8 *z;
    pBest->zName = (const char*)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->funcFlags = enc;
    memcpy((char*)&pBest[1], zName, nName+1);
    for(z=(u8*)pBest->zName; *z; z++) *z = sqlite3UpperToLower[*z];
    pOther = (FuncDef*)sqlite3HashInsert(&db->aFunc, pBest->zName, pBest);
    if( pOther==pBest ){
      sqlite3DbFree(db, pBest);
      sqlite3OomFault(db);
      return 0;
    }else{
      pBest->pNext = pOther;
    }
  }

  if( pBest && (pBest->xSFunc || createFlag) ){
    return pBest;
  }
  return 0;
}